

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O2

ReadFileResult anon_unknown.dwarf_a46a4f::VariableValueHelper(string *out,Value *value)

{
  bool bVar1;
  ReadFileResult RVar2;
  
  if (value == (Value *)0x0) {
    out->_M_string_length = 0;
    *(out->_M_dataplus)._M_p = '\0';
  }
  else {
    bVar1 = Json::Value::isBool(value);
    if (!bVar1) {
      RVar2 = std::
              function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
              ::operator()((function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                            *)(anonymous_namespace)::VariableStringHelper_abi_cxx11_,out,value);
      return RVar2;
    }
    Json::Value::asBool(value);
    std::__cxx11::string::assign((char *)out);
  }
  return READ_OK;
}

Assistant:

ReadFileResult VariableValueHelper(std::string& out, const Json::Value* value)
{
  if (!value) {
    out.clear();
    return ReadFileResult::READ_OK;
  }

  if (value->isBool()) {
    out = value->asBool() ? "TRUE" : "FALSE";
    return ReadFileResult::READ_OK;
  }

  return VariableStringHelper(out, value);
}